

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManMergeNodeCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  int *piVar5;
  uint uVar6;
  Amap_Cut_t AVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  Amap_Cut_t *pCut1;
  uint uVar11;
  uint uVar12;
  Amap_Cut_t *pCut0;
  uint uVar13;
  uint uVar14;
  Amap_Cut_t *pAVar15;
  uint uVar16;
  Amap_Cut_t *pAVar17;
  
  if (pNode->Fan[0] < 0) {
LAB_003c810d:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar6 = (uint)pNode->Fan[0] >> 1;
  uVar13 = p->vObjs->nSize;
  if ((int)uVar6 < (int)uVar13) {
    if (pNode->Fan[1] < 0) goto LAB_003c810d;
    uVar10 = (uint)pNode->Fan[1] >> 1;
    if (uVar10 < uVar13) {
      if ((pNode->field_11).pData != (void *)0x0) {
        __assert_fail("pNode->pData == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapMerge.c"
                      ,0x1c1,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
      }
      ppvVar2 = p->vObjs->pArray;
      pvVar3 = ppvVar2[uVar6];
      pvVar4 = ppvVar2[uVar10];
      if ((*(uint *)pNode & 7) == 4) {
        lVar8 = 0x80;
      }
      else {
        if ((*(uint *)pNode & 7) == 6) {
          Amap_ManMergeNodeCutsMux(p,pNode);
          return;
        }
        lVar8 = 0x88;
      }
      if (0xfff < *(uint *)((long)pvVar3 + 8)) {
        lVar8 = *(long *)((long)&p->pLib->pName + lVar8);
        pAVar17 = *(Amap_Cut_t **)((long)pvVar3 + 0x20);
        uVar13 = 0;
        do {
          if (pNode->Fan[0] < 0) {
LAB_003c80cf:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          AVar7 = *pAVar17;
          uVar14 = (uint)AVar7 >> 0x10 & 1;
          uVar10 = pNode->Fan[0] & 1;
          uVar6 = (uVar14 ^ uVar10) + ((uint)AVar7 & 0xffff) * 2;
          if (((uint)AVar7 & 0xffff) == 0) {
            uVar6 = 0;
          }
          if (uVar14 != uVar10 && ((uint)AVar7 & 0xfffe0000) == 0x20000) {
            if ((int)pAVar17[1] < 0) goto LAB_003c80ee;
            pAVar17[1] = (Amap_Cut_t)((uint)pAVar17[1] ^ 1);
          }
          puVar9 = *(uint **)(lVar8 + (ulong)uVar6 * 8);
          uVar11 = *puVar9;
          if (uVar11 != 0) {
            piVar5 = p->pMatsTemp;
            do {
              puVar9 = puVar9 + 1;
              piVar5[uVar11 & 0xffff] = (int)uVar11 >> 0x10;
              uVar11 = *puVar9;
            } while (uVar11 != 0);
          }
          if (0xfff < *(uint *)((long)pvVar4 + 8)) {
            pAVar15 = *(Amap_Cut_t **)((long)pvVar4 + 0x20);
            uVar11 = 0;
            do {
              if (pNode->Fan[1] < 0) goto LAB_003c80cf;
              AVar7 = *pAVar15;
              uVar12 = (uint)AVar7 >> 0x10 & 1;
              uVar16 = pNode->Fan[1] & 1;
              uVar1 = (uVar12 ^ uVar16) + ((uint)AVar7 & 0xffff) * 2;
              if (((uint)AVar7 & 0xffff) == 0) {
                uVar1 = 0;
              }
              piVar5 = p->pMatsTemp;
              if (piVar5[uVar1] != 0) {
                if (uVar12 != uVar16 && ((uint)AVar7 & 0xfffe0000) == 0x20000) {
                  if ((int)pAVar15[1] < 0) goto LAB_003c80ee;
                  pAVar15[1] = (Amap_Cut_t)((uint)pAVar15[1] ^ 1);
                }
                pCut1 = pAVar15;
                pCut0 = pAVar17;
                if (uVar6 < uVar1) {
                  pCut1 = pAVar17;
                  pCut0 = pAVar15;
                }
                Amap_ManCutCreate(p,pCut0,pCut1,piVar5[uVar1]);
                AVar7 = *pAVar15;
                if (((uint)AVar7 & 0xfffe0000) == 0x20000 && uVar12 != uVar16) {
                  if ((int)pAVar15[1] < 0) goto LAB_003c80ee;
                  pAVar15[1] = (Amap_Cut_t)((uint)pAVar15[1] ^ 1);
                }
              }
              uVar11 = uVar11 + 1;
              pAVar15 = pAVar15 + (ulong)((uint)AVar7 >> 0x11) + 1;
            } while (uVar11 < *(uint *)((long)pvVar4 + 8) >> 0xc);
          }
          AVar7 = *pAVar17;
          if (((uint)AVar7 & 0xfffe0000) == 0x20000 && uVar14 != uVar10) {
            if ((int)pAVar17[1] < 0) {
LAB_003c80ee:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf4,"int Abc_LitNot(int)");
            }
            pAVar17[1] = (Amap_Cut_t)((uint)pAVar17[1] ^ 1);
          }
          puVar9 = *(uint **)(lVar8 + (ulong)uVar6 * 8);
          uVar6 = *puVar9;
          if (uVar6 != 0) {
            piVar5 = p->pMatsTemp;
            do {
              puVar9 = puVar9 + 1;
              piVar5[uVar6 & 0xffff] = 0;
              uVar6 = *puVar9;
            } while (uVar6 != 0);
            AVar7 = *pAVar17;
          }
          uVar13 = uVar13 + 1;
          pAVar17 = pAVar17 + (ulong)((uint)AVar7 >> 0x11) + 1;
        } while (uVar13 < *(uint *)((long)pvVar3 + 8) >> 0xc);
      }
      Amap_ManCutSaveStored(p,pNode);
      p->nCutsUsed = p->nCutsUsed + (*(uint *)&pNode->field_0x8 >> 0xc);
      p->nCutsTried =
           p->nCutsTried +
           (*(uint *)((long)pvVar4 + 8) >> 0xc) * (*(uint *)((long)pvVar3 + 8) >> 0xc);
      if ((pNode->field_0x7 & 0x40) != 0) {
        Amap_ManMergeNodeChoice(p,pNode);
        return;
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Amap_ManMergeNodeCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int ** pRules, Entry, i, k, c, iCompl0, iCompl1, iFan0, iFan1;
    assert( pNode->pData == NULL );
    if ( pNode->Type == AMAP_OBJ_MUX )
    {
        Amap_ManMergeNodeCutsMux( p, pNode );
        return;
    }
    assert( pNode->Type != AMAP_OBJ_MUX );
    pRules = (pNode->Type == AMAP_OBJ_AND)? p->pLib->pRules: p->pLib->pRulesX;
    Amap_NodeForEachCut( pFanin0, pCut0, c )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        // complement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = (Entry >> 16);
        // iterate through the cuts
        Amap_NodeForEachCut( pFanin1, pCut1, k )
        {
            iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
            iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
            if ( p->pMatsTemp[iFan1] == 0 )
                continue;
            // complement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            // create new cut
            if ( iFan0 >= iFan1 )
                Amap_ManCutCreate( p, pCut0, pCut1, p->pMatsTemp[iFan1] );
            else
                Amap_ManCutCreate( p, pCut1, pCut0, p->pMatsTemp[iFan1] );
            // uncomplement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
        }
        // uncomplement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = 0;
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried += pFanin0->nCuts * pFanin1->nCuts;
//    assert( (int)pNode->nCuts == Amap_ManMergeCountCuts(p, pNode) );
    if ( pNode->fRepr )
        Amap_ManMergeNodeChoice( p, pNode );

//    Amap_ManPrintCuts( pNode );
}